

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O2

void __thiscall
dynamicgraph::command::CommandVoid3<dynamicgraph::CustomEntity,_int,_int,_int>::CommandVoid3
          (CommandVoid3<dynamicgraph::CustomEntity,_int,_int,_int> *this,CustomEntity *entity,
          function_t *function,string *docString)

{
  _Vector_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  _Stack_98;
  _Deque_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  local_80;
  
  boost::assign::list_of<dynamicgraph::command::Value::Type_const&>
            ((generic_list<dynamicgraph::command::Value::Type> *)&local_80,
             (assign *)&ValueHelper<int>::TypeID,(Type *)function);
  std::
  deque<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>::
  push_back((deque<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
             *)&local_80,(value_type *)&ValueHelper<int>::TypeID);
  std::
  deque<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>::
  push_back((deque<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
             *)&local_80,(value_type *)&ValueHelper<int>::TypeID);
  boost::assign_detail::
  converter<boost::assign_detail::generic_list<dynamicgraph::command::Value::Type>,std::_Deque_iterator<dynamicgraph::command::Value::Type,dynamicgraph::command::Value::Type&,dynamicgraph::command::Value::Type*>>
  ::
  convert_to_container<std::vector<dynamicgraph::command::Value::Type,std::allocator<dynamicgraph::command::Value::Type>>>
            ((vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
              *)&_Stack_98,&local_80);
  dynamicgraph::command::Command::Command
            (&this->super_Command,&entity->super_Entity,(vector *)&_Stack_98,(string *)docString);
  std::
  _Vector_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  ::~_Vector_base(&_Stack_98);
  std::
  _Deque_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  ::~_Deque_base(&local_80);
  *(undefined ***)this = &PTR__CommandVoid3_0011cae0;
  boost::function3<void,_const_int_&,_const_int_&,_const_int_&>::function3
            (&(this->fptr).super_function3<void,_const_int_&,_const_int_&,_const_int_&>,
             &function->super_function3<void,_const_int_&,_const_int_&,_const_int_&>);
  return;
}

Assistant:

CommandVoid3(E &entity, function_t function, const std::string &docString)
      : Command(entity,
                boost::assign::list_of(ValueHelper<T1>::TypeID)(
                    ValueHelper<T2>::TypeID)(ValueHelper<T3>::TypeID),
                docString),
        fptr(function) {}